

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O1

void __thiscall hand::sortHand(hand *this)

{
  pointer pcVar1;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> _Var2;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> _Var3;
  long lVar4;
  pointer pcVar5;
  vector<card,std::allocator<card>> *pvVar6;
  vector<card,_std::allocator<card>_> *pvVar7;
  vector<card,std::allocator<card>> **ppvVar8;
  ulong uVar9;
  pointer *__ptr;
  card *i;
  pointer pcVar10;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  regHand;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  specialHand;
  vector<card,std::allocator<card>> *local_38;
  vector<card,_std::allocator<card>_> *local_30;
  
  local_38 = (vector<card,std::allocator<card>> *)operator_new(0x18);
  *(undefined8 *)local_38 = 0;
  *(undefined8 *)(local_38 + 8) = 0;
  *(undefined8 *)(local_38 + 0x10) = 0;
  local_30 = (vector<card,_std::allocator<card>_> *)operator_new(0x18);
  (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar10 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar10 != pcVar1) {
    do {
      ppvVar8 = (vector<card,std::allocator<card>> **)&local_30;
      if (pcVar10->cardType == 0) {
        ppvVar8 = &local_38;
      }
      std::vector<card,_std::allocator<card>_>::push_back
                ((vector<card,_std::allocator<card>_> *)*ppvVar8,pcVar10);
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar1);
  }
  _Var2._M_current = *(card **)local_38;
  _Var3._M_current = *(card **)(local_38 + 8);
  if (_Var2._M_current != _Var3._M_current) {
    uVar9 = ((long)_Var3._M_current - (long)_Var2._M_current >> 4) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
              (_Var2,_Var3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x1028fe);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
              (_Var2,_Var3,(_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x1028fe);
  }
  _Var2._M_current =
       (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  _Var3._M_current =
       (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (_Var2._M_current != _Var3._M_current) {
    uVar9 = ((long)_Var3._M_current - (long)_Var2._M_current >> 4) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
              (_Var2,_Var3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x102908);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
              (_Var2,_Var3,(_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x102908);
  }
  std::vector<card,std::allocator<card>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>>
            (local_38,*(undefined8 *)(local_38 + 8),
             (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (local_30->super__Vector_base<card,_std::allocator<card>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  pvVar7 = local_30;
  pcVar1 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar10 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)local_38;
  (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)(local_38 + 8);
  (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(local_38 + 0x10);
  *(pointer *)local_38 = pcVar1;
  *(pointer *)(local_38 + 8) = pcVar5;
  *(pointer *)(local_38 + 0x10) = pcVar10;
  if (local_30 != (vector<card,_std::allocator<card>_> *)0x0) {
    std::vector<card,_std::allocator<card>_>::~vector(local_30);
    operator_delete(pvVar7);
  }
  pvVar6 = local_38;
  if (local_38 != (vector<card,std::allocator<card>> *)0x0) {
    std::vector<card,_std::allocator<card>_>::~vector
              ((vector<card,_std::allocator<card>_> *)local_38);
    operator_delete(pvVar6);
  }
  return;
}

Assistant:

void hand::sortHand() {
    unique_ptr <vector<card>> regHand(new vector<card>);
    unique_ptr <vector<card>> specialHand(new vector<card>);
    for (auto &i : hand_) {
        if(isRegularCard(i))regHand->push_back(i);
        else specialHand->push_back(i);
    }
    sort(regHand->begin(),regHand->end(),sortByValue);
    sort(specialHand->begin(),specialHand->end(),sortByName);
    regHand->insert(regHand->end(),specialHand->begin(),specialHand->end());
    hand_.swap(*regHand);
}